

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O0

int __thiscall HighsNodeQueue::link(HighsNodeQueue *this,char *__from,char *__to)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  reference pvVar2;
  HighsNodeQueue *unaff_retaddr;
  int64_t in_stack_00000048;
  HighsNodeQueue *in_stack_00000050;
  HighsNodeQueue *this_00;
  int64_t in_stack_fffffffffffffff8;
  
  this_00 = this;
  pvVar2 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
           operator[](&this->nodes,(size_type)__from);
  if (pvVar2->lower_bound < this->optimality_limit || pvVar2->lower_bound == this->optimality_limit)
  {
    link_estim(this_00,(int64_t)__from);
    link_lower(this_00,(int64_t)__from);
    link_domchgs(in_stack_00000050,in_stack_00000048);
    iVar1 = extraout_EAX_00;
  }
  else {
    pvVar2 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
             operator[](&this->nodes,(size_type)__from);
    pvVar2->estimate = INFINITY;
    link_suboptimal(unaff_retaddr,in_stack_fffffffffffffff8);
    link_domchgs(in_stack_00000050,in_stack_00000048);
    pvVar2 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
             operator[](&this->nodes,(size_type)__from);
    ldexp(1.0,1 - pvVar2->depth);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

double HighsNodeQueue::link(int64_t node) {
  if (nodes[node].lower_bound > optimality_limit) {
    assert(nodes[node].estimate != kHighsInf);
    nodes[node].estimate = kHighsInf;
    link_suboptimal(node);
    link_domchgs(node);
    return std::ldexp(1.0, 1 - nodes[node].depth);
  }

  link_estim(node);
  link_lower(node);
  link_domchgs(node);
  return 0.0;
}